

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::RuntimeCharSet<char16_t>::Print(RuntimeCharSet<char16_t> *this,DebugWriter *w)

{
  bool bVar1;
  Char CVar2;
  uint local_20;
  uint local_1c;
  uint i;
  int start;
  DebugWriter *w_local;
  RuntimeCharSet<char16_t> *this_local;
  
  DebugWriter::Print(w,L"[");
  local_1c = 0xffffffff;
  for (local_20 = 0; local_20 < 0x10000; local_20 = local_20 + 1) {
    CVar2 = Chars<char16_t>::UTC(local_20);
    bVar1 = Get(this,CVar2);
    if (bVar1) {
      if ((int)local_1c < 0) {
        local_1c = local_20;
        CVar2 = Chars<char16_t>::UTC(local_20);
        DebugWriter::PrintEscapedChar(w,CVar2);
      }
    }
    else if (-1 < (int)local_1c) {
      if (local_1c + 1 < local_20) {
        if (local_1c + 2 < local_20) {
          DebugWriter::Print(w,L"-");
        }
        CVar2 = Chars<char16_t>::UTC(local_20 - 1);
        DebugWriter::PrintEscapedChar(w,CVar2);
      }
      local_1c = 0xffffffff;
    }
  }
  if (-1 < (int)local_1c) {
    if (local_1c < 0xfffe) {
      DebugWriter::Print(w,L"-");
    }
    DebugWriter::PrintEscapedChar(w,L'\xffff');
  }
  DebugWriter::Print(w,L"]");
  return;
}

Assistant:

void RuntimeCharSet<char16>::Print(DebugWriter* w) const
    {
        w->Print(_u("["));
        int start = -1;
        for (uint i = 0; i < NumChars; i++)
        {
            if (Get(UTC(i)))
            {
                if (start < 0)
                {
                    start = i;
                    w->PrintEscapedChar(UTC(i));
                }
            }
            else
            {
                if (start >= 0)
                {
                    if (i > (uint)(start + 1))
                    {
                        if (i  > (uint)(start + 2))
                            w->Print(_u("-"));
                        w->PrintEscapedChar(UTC(i - 1));
                    }
                    start = -1;
                }
            }
        }
        if (start >= 0)
        {
            if ((uint)start < MaxUChar - 1)
                w->Print(_u("-"));
            w->PrintEscapedChar(MaxChar);
        }
        w->Print(_u("]"));
    }